

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdUtils.c
# Opt level: O0

char ** CmdDupArgv(int argc,char **argv)

{
  char **ppcVar1;
  char *pcVar2;
  int local_24;
  int i;
  char **argvNew;
  char **argv_local;
  int argc_local;
  
  ppcVar1 = (char **)malloc((long)argc << 3);
  for (local_24 = 0; local_24 < argc; local_24 = local_24 + 1) {
    pcVar2 = Abc_UtilStrsav(argv[local_24]);
    ppcVar1[local_24] = pcVar2;
  }
  return ppcVar1;
}

Assistant:

char ** CmdDupArgv( int argc, char **argv )
{
    char ** argvNew = ABC_ALLOC( char *, argc );
    int i;
    for ( i = 0; i < argc; i++ )
        argvNew[i] = Abc_UtilStrsav( argv[i] );
    return argvNew;
}